

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  char *pcVar2;
  ostream *poVar3;
  size_type sVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  double dVar7;
  int local_188;
  allocator local_181;
  int i_1;
  string path;
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  int local_38;
  byte local_31;
  int i;
  bool dmc2wav_mode;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_file_list;
  char **argv_local;
  int argc_local;
  
  in_file_list.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = (size_t)argv;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&i);
  local_31 = 0;
  for (local_38 = 1; local_38 < argc; local_38 = local_38 + 1) {
    if (**(char **)(in_file_list.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node._M_size + (long)local_38 * 8) == '-') {
      switch(*(undefined1 *)
              (*(long *)(in_file_list.
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node._M_size + (long)local_38 * 8) + 1)) {
      case 99:
        lVar1 = *(long *)(in_file_list.
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl._M_node._M_size + (long)local_38 * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b8,(char *)(lVar1 + 2),&local_b9);
        center_bias_level = std::__cxx11::stoi((string *)local_b8,(size_t *)0x0,10);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        if (0x7f < center_bias_level) {
          help_mode = true;
        }
        if (center_bias_level < 0) {
          help_mode = true;
        }
        break;
      case 100:
        lVar1 = *(long *)(in_file_list.
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl._M_node._M_size + (long)local_38 * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_130,(char *)(lVar1 + 2),&local_131);
        dither_mode = std::__cxx11::stoi((string *)local_130,(size_t *)0x0,10);
        std::__cxx11::string::~string(local_130);
        std::allocator<char>::~allocator((allocator<char> *)&local_131);
        if ((dither_mode < 0) || (3 < dither_mode)) {
          help_mode = true;
        }
        break;
      case 0x65:
        output_envelope = true;
        break;
      case 0x66:
        local_31 = 1;
        break;
      case 0x67:
        lVar1 = *(long *)(in_file_list.
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl._M_node._M_size + (long)local_38 * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_58,(char *)(lVar1 + 2),&local_59);
        wave_gain = std::__cxx11::stod((string *)local_58,(size_t *)0x0);
        std::__cxx11::string::~string(local_58);
        std::allocator<char>::~allocator((allocator<char> *)&local_59);
        break;
      case 0x68:
        help_mode = true;
        break;
      case 0x69:
        lVar1 = *(long *)(in_file_list.
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl._M_node._M_size + (long)local_38 * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_90,(char *)(lVar1 + 2),&local_91);
        force_initial_volume = std::__cxx11::stoi((string *)local_90,(size_t *)0x0,10);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
        if (0x7f < force_initial_volume) {
          help_mode = true;
        }
        if (force_initial_volume < 0) {
          help_mode = true;
        }
        break;
      default:
        poVar3 = std::operator<<((ostream *)&std::cout,"Invalid option: ");
        poVar3 = std::operator<<(poVar3,*(char **)(in_file_list.
                                                                                                      
                                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl._M_node._M_size + (long)local_38 * 8));
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        help_mode = true;
        break;
      case 0x6c:
        use_linearity_correction = false;
        break;
      case 0x6e:
        no_resampling = true;
        break;
      case 0x6f:
        output_encoded_wav = true;
        break;
      case 0x70:
        output_preprocessed = true;
        break;
      case 0x72:
        lVar1 = *(long *)(in_file_list.
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl._M_node._M_size + (long)local_38 * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_108,(char *)(lVar1 + 2),&local_109);
        sample_rate_ind = std::__cxx11::stoi((string *)local_108,(size_t *)0x0,10);
        std::__cxx11::string::~string(local_108);
        std::allocator<char>::~allocator((allocator<char> *)&local_109);
        if ((0xf < sample_rate_ind) || (sample_rate_ind < 0)) {
          help_mode = true;
        }
        break;
      case 0x73:
        lVar1 = *(long *)(in_file_list.
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl._M_node._M_size + (long)local_38 * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_158,(char *)(lVar1 + 2),&local_159);
        noise_shape_mode = std::__cxx11::stoi((string *)local_158,(size_t *)0x0,10);
        std::__cxx11::string::~string(local_158);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
        if ((noise_shape_mode < 0) || (3 < noise_shape_mode)) {
          help_mode = true;
        }
        break;
      case 0x77:
        lVar1 = *(long *)(in_file_list.
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl._M_node._M_size + (long)local_38 * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e0,(char *)(lVar1 + 2),&local_e1);
        shifter_weight = std::__cxx11::stod((string *)local_e0,(size_t *)0x0);
        std::__cxx11::string::~string(local_e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      }
    }
    else {
      pcVar2 = *(char **)(in_file_list.
                          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl._M_node._M_size + (long)local_38 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&i_1,pcVar2,&local_181);
      std::allocator<char>::~allocator((allocator<char> *)&local_181);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i,(value_type *)&i_1);
      std::__cxx11::string::~string((string *)&i_1);
    }
  }
  if (((help_mode & 1U) == 0) &&
     (sVar4 = std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i), sVar4 != 0)) {
    if ((local_31 & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"gain: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::showpoint);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,wave_gain);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      if (force_initial_volume < 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"initial volume: auto");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"center bias level: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,center_bias_level);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"slope weight: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::showpoint);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,shifter_weight);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      switch(dither_mode) {
      case 0:
        poVar3 = std::operator<<((ostream *)&std::cout,"dither: off");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        break;
      case 1:
        poVar3 = std::operator<<((ostream *)&std::cout,"dither: Rectangle");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        break;
      case 2:
        poVar3 = std::operator<<((ostream *)&std::cout,"dither: Triangle");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        break;
      case 3:
        poVar3 = std::operator<<((ostream *)&std::cout,"dither: Highpass Triangle");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      switch(noise_shape_mode) {
      case 0:
        poVar3 = std::operator<<((ostream *)&std::cout,"noise shape: off");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        break;
      case 1:
        poVar3 = std::operator<<((ostream *)&std::cout,"noise shape: Lowpass");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        break;
      case 2:
        poVar3 = std::operator<<((ostream *)&std::cout,"noise shape: Highpass");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        break;
      case 3:
        poVar3 = std::operator<<((ostream *)&std::cout,"noise shape: equal-loudness");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      if ((use_linearity_correction & 1U) == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"linearity correction: off");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"linearity correction: on");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      cVar5 = std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::cbegin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&i);
      cVar6 = std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::cend((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i);
      std::for_each<std::_List_const_iterator<std::__cxx11::string>,main::__1>
                (cVar5._M_node,cVar6._M_node);
    }
    else {
      if (force_initial_volume < 0) {
        force_initial_volume = 0x40;
      }
      cVar5 = std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::cbegin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&i);
      cVar6 = std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::cend((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&i);
      std::for_each<std::_List_const_iterator<std::__cxx11::string>,main::__0>
                (cVar5._M_node,cVar6._M_node);
    }
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i);
    return 0;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Usage: dpcmc [options] <input> ..");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "<input> supports uncompressed WAV, AIFF/AIFC, SND (AU), MAT-file (Matlab)"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Options:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"  -g[gain]   Input volume(default:gain=1.0)");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"  -i[0..127] Initial volume(default:auto)");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"  -c[0..127] Center bias level(default:64)");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"  -w[weight] Slope weight(default:weight=1.0)");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "  -r[rate]   Output sampling rate(default:15) rate:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (local_188 = 0; local_188 < 0x10; local_188 = local_188 + 1) {
    if (local_188 % 4 == 0) {
      std::operator<<((ostream *)&std::cout,"                 ");
    }
    if (local_188 < 10) {
      std::operator<<((ostream *)&std::cout," ");
    }
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_188);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::showpoint);
    dVar7 = dpcmSampleRateValue(local_188);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
    std::operator<<(poVar3,"Hz ");
    if (local_188 % 4 == 3) {
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"  -n         No resampling");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"  -d[mode]   Dither mode:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"                 0 : off");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"                 1 : Rectangle");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"                 2 : Triangle");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"                 3 : Highpassed Triangle(default)"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"  -s[mode]   Noise shaping mode:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"                 0 : off");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"                 1 : Lowpass");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"                 2 : Highpass");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"                 3 : equal-loudness(default)");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "  -l         Disable correction of linearity(default:enable)");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "  -e         Output envelope to wav file(default:off)");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "  -p         Output preprocessed waveform to wav file(default:off)");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "  -o         Output waveform after encode to wav file(default:off)");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"  -f         Convert dmc to wav file");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"  -h         Show this help");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

int main(int argc, char * argv[])
{
	std::list<std::string> in_file_list;

	bool dmc2wav_mode = false;
	
	// コマンドラインオプションを処理する
	for (int i=1; i<argc; ++i) {
		if (argv[i][0] == '-') {
			switch (argv[i][1]) {
				case 'g':
					wave_gain = std::stod(&argv[i][2]);
					break;
					
				case 'i':
					force_initial_volume = std::stoi(&argv[i][2]);
					if (force_initial_volume > 127) help_mode = true;
					if (force_initial_volume < 0) help_mode = true;
					break;
					
				case 'c':
					center_bias_level = std::stoi(&argv[i][2]);
					if (center_bias_level > 127) help_mode = true;
					if (center_bias_level < 0) help_mode = true;
					break;

				case 'w':
					shifter_weight = std::stod(&argv[i][2]);
					break;
					
				case 'r':
					sample_rate_ind = std::stoi(&argv[i][2]);
					if (sample_rate_ind > 15 || sample_rate_ind < 0) {
						help_mode = true;
					}
					break;
					
				case 'n':
					no_resampling = true;
					break;
					
				case 'd':
					dither_mode = std::stoi(&argv[i][2]);
					if (dither_mode < 0 || dither_mode > 3) {
						help_mode = true;
					}
					break;
					
				case 's':
					noise_shape_mode = std::stoi(&argv[i][2]);
					if (noise_shape_mode < 0 || noise_shape_mode > 3) {
						help_mode = true;
					}
					break;

				case 'l':
					use_linearity_correction = false;
					break;
					
				case 'e':
					output_envelope = true;
					break;
					
				case 'p':
					output_preprocessed = true;
					break;

				case 'o':
					output_encoded_wav = true;
					break;

				case 'h':
					help_mode = true;
					break;
					
				case 'f':
					dmc2wav_mode = true;
					break;
					
				default:
					std::cout << "Invalid option: " << argv[i] << std::endl;
					help_mode = true;
					break;
			}
		}
		else {
			std::string path(argv[i]);
			in_file_list.push_back(path);
		}
	}
	
	if (help_mode || (in_file_list.size() == 0)) {
		std::cout << "Usage: dpcmc [options] <input> .." << std::endl;
		std::cout << "<input> supports uncompressed WAV, AIFF/AIFC, SND (AU), MAT-file (Matlab)" << std::endl;
		std::cout << "Options:" << std::endl;
		std::cout << "  -g[gain]   Input volume(default:gain=1.0)" << std::endl;
		std::cout << "  -i[0..127] Initial volume(default:auto)" << std::endl;
		std::cout << "  -c[0..127] Center bias level(default:64)" << std::endl;
		std::cout << "  -w[weight] Slope weight(default:weight=1.0)" << std::endl;
		std::cout << "  -r[rate]   Output sampling rate(default:15) rate:" << std::endl;
		for (int i=0; i<16; ++i) {
			if ((i % 4) == 0) {
				std::cout << "                 ";
			}
			if (i < 10) {
				std::cout << " ";
			}
			std::cout << i << ":" << std::showpoint << dpcmSampleRateValue(i) << "Hz ";
			if ((i % 4) == 3) {
				std::cout << std::endl;
			}
		}
		std::cout << "  -n         No resampling" << std::endl;
		std::cout << "  -d[mode]   Dither mode:" << std::endl;
		std::cout << "                 0 : off" << std::endl;
		std::cout << "                 1 : Rectangle" << std::endl;
		std::cout << "                 2 : Triangle" << std::endl;
		std::cout << "                 3 : Highpassed Triangle(default)" << std::endl;
		std::cout << "  -s[mode]   Noise shaping mode:" << std::endl;
		std::cout << "                 0 : off" << std::endl;
		std::cout << "                 1 : Lowpass" << std::endl;
		std::cout << "                 2 : Highpass" << std::endl;
		std::cout << "                 3 : equal-loudness(default)" << std::endl;
		std::cout << "  -l         Disable correction of linearity(default:enable)" << std::endl;
		std::cout << "  -e         Output envelope to wav file(default:off)" << std::endl;
		std::cout << "  -p         Output preprocessed waveform to wav file(default:off)" << std::endl;
		std::cout << "  -o         Output waveform after encode to wav file(default:off)" << std::endl;
		std::cout << "  -f         Convert dmc to wav file" << std::endl;
		std::cout << "  -h         Show this help" << std::endl;
		exit(0);
	}
	
	if (dmc2wav_mode) {
		if (force_initial_volume < 0) {
			force_initial_volume = 64;
		}
		
		std::for_each(in_file_list.cbegin(), in_file_list.cend(), [](std::string in_file_path) {
			processDmcInputFile(in_file_path);
		});
	}
	else {
		std::cout << "gain: " << std::showpoint << wave_gain << std::endl;
		if (force_initial_volume < 0) {
			std::cout << "initial volume: auto" << std::endl;
		}
		std::cout << "center bias level: " << center_bias_level << std::endl;
		std::cout << "slope weight: " << std::showpoint << shifter_weight << std::endl;
		switch (dither_mode) {
			case 0:
				std::cout << "dither: off" << std::endl;
				break;
			case 1:
				std::cout << "dither: Rectangle" << std::endl;
				break;
			case 2:
				std::cout << "dither: Triangle" << std::endl;
				break;
			case 3:
				std::cout << "dither: Highpass Triangle" << std::endl;
				break;
			default:
				break;
		}
		switch (noise_shape_mode) {
			case 0:
				std::cout << "noise shape: off" << std::endl;
				break;
			case 1:
				std::cout << "noise shape: Lowpass" << std::endl;
				break;
			case 2:
				std::cout << "noise shape: Highpass" << std::endl;
				break;
			case 3:
				std::cout << "noise shape: equal-loudness" << std::endl;
				break;
			default:
				break;
		}
		if (use_linearity_correction) {
			std::cout << "linearity correction: on" << std::endl;
		}
		else {
			std::cout << "linearity correction: off" << std::endl;
		}

		std::for_each(in_file_list.cbegin(), in_file_list.cend(), [](std::string in_file_path) {
			processInputFile(in_file_path);
		});
	}
	
	return 0;
}